

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O2

void __thiscall PluginFverb::run(PluginFverb *this,float **inputs,float **outputs,uint32_t frames)

{
  Fverb *this_00;
  EVP_PKEY_CTX *ctx;
  uint32_t ch;
  long lVar1;
  DenormalDisabler dd;
  int temp;
  int temp_1;
  DenormalDisabler local_3c [3];
  
  if (frames != 0) {
    ctx = (EVP_PKEY_CTX *)inputs;
    WebCore::DenormalDisabler::DenormalDisabler(local_3c);
    if (0.5 < this->fBypass || this->fBypass == 0.5) {
      for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
        if (inputs[lVar1] != outputs[lVar1]) {
          memmove(outputs[lVar1],inputs[lVar1],(ulong)frames << 2);
        }
      }
      this->fWasBypass = true;
    }
    else {
      if (this->fWasBypass == true) {
        clear(this);
        this->fWasBypass = false;
      }
      if (this->fVintage != this->fWasVintage) {
        this_00 = (this->fDsp)._M_t.super___uniq_ptr_impl<Fverb,_std::default_delete<Fverb>_>._M_t.
                  super__Tuple_impl<0UL,_Fverb_*,_std::default_delete<Fverb>_>.
                  super__Head_base<0UL,_Fverb_*,_false>._M_head_impl;
        if (this->fVintage == false) {
          DISTRHO::Plugin::getSampleRate(&this->super_Plugin);
        }
        Fverb::init(this_00,ctx);
        clear(this);
        this->fWasVintage = this->fVintage;
      }
      runSegmented(this,inputs,outputs,frames);
    }
    MXCSR = local_3c[0].m_savedCSR;
  }
  return;
}

Assistant:

void PluginFverb::run(const float **inputs, float **outputs, uint32_t frames)
{
    if (frames < 1)
        return;

    WebCore::DenormalDisabler dd;

    if (fBypass < 0.5f) {
        // TODO make it smooth
        if (fWasBypass) {
            clear();
            fWasBypass = false;
        }
        if (fVintage != fWasVintage) {
            fDsp->init(fVintage ? kVintageSampleRate : getSampleRate());
            clear();
            fWasVintage = fVintage;
        }
        runSegmented(inputs, outputs, frames);
    }
    else {
        for (uint32_t ch = 0; ch < kNumChannels; ++ch) {
            if (inputs[ch] != outputs[ch])
                std::copy_n(inputs[ch], frames, outputs[ch]);
        }
        fWasBypass = true;
    }
}